

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PType::VisitedNodeSet::Insert(VisitedNodeSet *this,PType *node)

{
  bool bVar1;
  size_t sVar2;
  size_t buck;
  PType *node_local;
  VisitedNodeSet *this_local;
  
  bVar1 = Check(this,node);
  if (bVar1) {
    __assert_fail("!Check(node) && \"Node was already inserted\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0x174,"void PType::VisitedNodeSet::Insert(PType *)");
  }
  sVar2 = Hash(this,node);
  node->VisitNext = this->Buckets[sVar2 & 0x1f];
  this->Buckets[sVar2 & 0x1f] = node;
  return;
}

Assistant:

void PType::VisitedNodeSet::Insert(PType *node)
{
	assert(!Check(node) && "Node was already inserted");
	size_t buck = Hash(node) & (countof(Buckets) - 1);
	node->VisitNext = Buckets[buck];
	Buckets[buck] = node;
}